

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O0

void mp_reduce_mod_2to(mp_int *x,size_t p)

{
  ulong local_28;
  size_t mask;
  size_t word;
  size_t p_local;
  mp_int *x_local;
  
  local_28 = (1L << ((byte)p & 0x3f)) - 1;
  for (mask = p >> 6; mask < x->nw; mask = mask + 1) {
    x->w[mask] = local_28 & x->w[mask];
    local_28 = 0;
  }
  return;
}

Assistant:

void mp_reduce_mod_2to(mp_int *x, size_t p)
{
    size_t word = p / BIGNUM_INT_BITS;
    size_t mask = ((size_t)1 << (p % BIGNUM_INT_BITS)) - 1;
    for (; word < x->nw; word++) {
        x->w[word] &= mask;
        mask = 0;
    }
}